

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# select.c
# Opt level: O1

int select_del(event_base *base,int fd,short old,short events,void *p)

{
  ulong *puVar1;
  int *piVar2;
  byte bVar3;
  int iVar4;
  
  if ((events & 8U) == 0) {
    piVar2 = (int *)base->evbase;
    if (fd <= *piVar2) {
      if ((events & 2U) != 0) {
        bVar3 = (byte)fd & 0x3f;
        iVar4 = fd + 0x3f;
        if (-1 < fd) {
          iVar4 = fd;
        }
        puVar1 = (ulong *)(*(long *)(piVar2 + 4) + (long)(iVar4 >> 6) * 8);
        *puVar1 = *puVar1 & (-2L << bVar3 | 0xfffffffffffffffeU >> 0x40 - bVar3);
      }
      if ((events & 4U) != 0) {
        bVar3 = (byte)fd & 0x3f;
        iVar4 = fd + 0x3f;
        if (-1 < fd) {
          iVar4 = fd;
        }
        puVar1 = (ulong *)(*(long *)(piVar2 + 6) + (long)(iVar4 >> 6) * 8);
        *puVar1 = *puVar1 & (-2L << bVar3 | 0xfffffffffffffffeU >> 0x40 - bVar3);
      }
    }
    return 0;
  }
  select_del_cold_1();
}

Assistant:

static int
select_del(struct event_base *base, int fd, short old, short events, void *p)
{
	struct selectop *sop = base->evbase;
	(void)p;

	EVUTIL_ASSERT((events & EV_SIGNAL) == 0);
	check_selectop(sop);

	if (sop->event_fds < fd) {
		check_selectop(sop);
		return (0);
	}

	if (events & EV_READ)
		FD_CLR(fd, sop->event_readset_in);

	if (events & EV_WRITE)
		FD_CLR(fd, sop->event_writeset_in);

	check_selectop(sop);
	return (0);
}